

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O1

int dfsfast_r(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  uint uVar1;
  Flow_Data_t *pFVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  int *piVar5;
  MinRegMan_t *pMVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  
  if (pManMR->fSinkDistTerminate != 0) {
    return 0;
  }
  uVar7 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar7 == 8) ||
     ((pManMR->fIsForward != 0 &&
      ((uVar7 == 3 ||
       ((pManMR->fIsForward != 0 &&
        ((*(uint *)(pManMR->pDataArray + (uint)pObj->Id) & pManMR->constraintMask & 0x90) != 0))))))
     )) {
    if (pPred != (Abc_Obj_t *)0x0) {
      return 1;
    }
    __assert_fail("pPred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretFlow.c"
                  ,0x147,"int dfsfast_r(Abc_Obj_t *, Abc_Obj_t *)");
  }
  *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 2;
  pFVar2 = pManMR->pDataArray;
  uVar7 = pObj->Id;
  if ((undefined1  [24])((undefined1  [24])pFVar2[uVar7] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    if ((((undefined1  [24])((undefined1  [24])pFVar2[uVar7] & (undefined1  [24])0x1) ==
          (undefined1  [24])0x0) &&
        (*(uint *)&pFVar2[uVar7].field_0x10 >> 0x10 ==
         (*(uint *)&pFVar2[uVar7].field_0x10 & 0xffff) + 1)) &&
       (iVar8 = dfsfast_e(pObj,pObj), iVar8 != 0)) {
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 4;
LAB_004d8772:
      FSETPRED(pObj,pPred);
LAB_004d877d:
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffd;
      return 1;
    }
  }
  else {
    pAVar3 = pFVar2[uVar7].field_1.pred;
    if ((((pAVar3 != (Abc_Obj_t *)0x0) &&
         ((undefined1  [24])((undefined1  [24])pFVar2[(uint)pAVar3->Id] & (undefined1  [24])0x1) ==
          (undefined1  [24])0x0)) &&
        ((uint)*(ushort *)&pFVar2[uVar7].field_0x12 ==
         *(ushort *)&pFVar2[(uint)pAVar3->Id].field_0x10 + 1)) &&
       (iVar8 = dfsfast_e(pAVar3,pAVar3), iVar8 != 0)) goto LAB_004d8772;
  }
  if (pManMR->fIsForward != 0) {
    if (0 < (pObj->vFanins).nSize) {
      lVar14 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar14]];
        pFVar2 = pManMR->pDataArray;
        if ((((undefined1  [24])((undefined1  [24])pFVar2[(uint)pAVar3->Id] & (undefined1  [24])0x2)
              == (undefined1  [24])0x0) &&
            ((uint)*(ushort *)&pFVar2[(uint)pObj->Id].field_0x12 ==
             *(ushort *)&pFVar2[(uint)pAVar3->Id].field_0x12 + 1)) &&
           (((*(uint *)&pAVar3->field_0x14 & 0xf) != 8 &&
            (iVar8 = dfsfast_r(pAVar3,pPred), iVar8 != 0)))) goto LAB_004d877d;
        lVar14 = lVar14 + 1;
      } while (lVar14 < (pObj->vFanins).nSize);
    }
    if (pManMR->maxDelay != 0) {
      uVar9 = (ulong)(uint)pObj->Id;
      if (0 < pManMR->vTimeEdges[uVar9].nSize) {
        pVVar11 = pManMR->vTimeEdges + uVar9;
        lVar14 = 0;
        do {
          pFVar2 = pManMR->pDataArray;
          uVar7 = ((Abc_Obj_t *)pVVar11->pArray[lVar14])->Id;
          if ((((undefined1  [24])((undefined1  [24])pFVar2[uVar7] & (undefined1  [24])0x2) ==
                (undefined1  [24])0x0) &&
              ((uint)*(ushort *)&pFVar2[uVar9].field_0x12 ==
               *(ushort *)&pFVar2[uVar7].field_0x12 + 1)) &&
             (iVar8 = dfsfast_r((Abc_Obj_t *)pVVar11->pArray[lVar14],pPred), iVar8 != 0))
          goto LAB_004d877d;
          lVar14 = lVar14 + 1;
          uVar9 = (ulong)(uint)pObj->Id;
          pVVar11 = pManMR->vTimeEdges + uVar9;
        } while (lVar14 < pManMR->vTimeEdges[uVar9].nSize);
      }
    }
  }
  *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffd;
  pFVar2 = pManMR->pDataArray;
  uVar7 = pObj->Id;
  uVar1 = *(uint *)&pFVar2[uVar7].field_0x10;
  if ((undefined1  [24])((undefined1  [24])pFVar2[uVar7] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    uVar13 = uVar1 & 0xffff;
    if (uVar13 == 0) {
      uVar10 = 30000;
      goto LAB_004d890a;
    }
  }
  else {
    uVar10 = 30000;
    if ((pFVar2[uVar7].field_1.pred == (Abc_Obj_t *)0x0) ||
       (uVar13 = (uint)*(ushort *)&pFVar2[(uint)(pFVar2[uVar7].field_1.pred)->Id].field_0x10,
       *(ushort *)&pFVar2[(uint)(pFVar2[uVar7].field_1.pred)->Id].field_0x10 == 0))
    goto LAB_004d890a;
  }
  uVar10 = 30000;
  if (uVar13 < 30000) {
    uVar10 = uVar13;
  }
LAB_004d890a:
  if (pManMR->fIsForward != 0) {
    lVar14 = (long)(pObj->vFanins).nSize;
    if (0 < lVar14) {
      lVar12 = 0;
      do {
        pvVar4 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar12]];
        if ((((*(uint *)((long)pvVar4 + 0x14) & 0xf) != 8) &&
            (0xffff < *(uint *)&pFVar2[*(uint *)((long)pvVar4 + 0x10)].field_0x10)) &&
           (uVar13 = *(uint *)&pFVar2[*(uint *)((long)pvVar4 + 0x10)].field_0x10 >> 0x10,
           uVar13 <= uVar10)) {
          uVar10 = uVar13;
        }
        lVar12 = lVar12 + 1;
      } while (lVar14 != lVar12);
    }
    if (pManMR->maxDelay != 0) {
      lVar14 = (long)pManMR->vTimeEdges[uVar7].nSize;
      if (0 < lVar14) {
        lVar12 = 0;
        do {
          uVar13 = *(uint *)&pFVar2[*(uint *)((long)pManMR->vTimeEdges[uVar7].pArray[lVar12] + 0x10)
                                   ].field_0x10 >> 0x10;
          if (uVar10 < uVar13) {
            uVar13 = uVar10;
          }
          if (0xffff < *(uint *)&pFVar2[*(uint *)((long)pManMR->vTimeEdges[uVar7].pArray[lVar12] +
                                                 0x10)].field_0x10) {
            uVar10 = uVar13;
          }
          lVar12 = lVar12 + 1;
        } while (lVar14 != lVar12);
      }
    }
  }
  uVar9 = (ulong)(uVar10 + 1);
  if (0x752e < uVar10) {
    uVar9 = 0;
  }
  *(uint *)&pFVar2[uVar7].field_0x10 = uVar1 & 0xffff | (int)uVar9 << 0x10;
  pMVar6 = pManMR;
  if ((int)uVar9 < pManMR->vSinkDistHist->nSize) {
    piVar5 = pManMR->vSinkDistHist->pArray;
    piVar5[uVar1 >> 0x10] = piVar5[uVar1 >> 0x10] + -1;
    piVar5[uVar9] = piVar5[uVar9] + 1;
    if (piVar5[uVar1 >> 0x10] == 0) {
      pMVar6->fSinkDistTerminate = 1;
    }
    return 0;
  }
  __assert_fail("min_dist < Vec_IntSize(pManMR->vSinkDistHist)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretFlow.c"
                ,0x1fb,"void dfsfast_r_retreat(Abc_Obj_t *)");
}

Assistant:

int dfsfast_r( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext, *pOldPred;

  if (pManMR->fSinkDistTerminate) return 0;

#ifdef DEBUG_VISITED
  printf("(%dr=%d) ", Abc_ObjId(pObj), FDATA(pObj)->r_dist);
#endif  

  // have we reached the sink?
  if (Abc_ObjIsLatch(pObj) ||
      (pManMR->fIsForward && Abc_ObjIsPo(pObj)) || 
      (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
    assert(pPred);
    return 1;
  }

  FSET(pObj, VISITED_R);

  if (FTEST(pObj, FLOW)) {

    pOldPred = FGETPRED(pObj);
    if (pOldPred && 
        !FTEST(pOldPred, VISITED_E) &&
        FDIST(pObj, r, pOldPred, e) &&
        dfsfast_e(pOldPred, pOldPred)) {

      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("fr");
#endif
      goto found;
    }
    
  } else {

    if (!FTEST(pObj, VISITED_E) &&
        FDIST(pObj, r, pObj, e) &&
        dfsfast_e(pObj, pObj)) {

      FSET(pObj, FLOW);
      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("f");
#endif
      goto found;
    }
  }
 
  // 2. reverse edges (forward retiming only)
  if (pManMR->fIsForward) {
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          FDIST(pObj, r, pNext, r) &&
          !Abc_ObjIsLatch(pNext) &&
          dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }
  
  // 3. timing edges (forward retiming only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_R) &&
            FDIST(pObj, r, pNext, r) &&
            dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  FUNSET(pObj, VISITED_R);
  dfsfast_r_retreat(pObj);
  return 0;

 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif
  FUNSET(pObj, VISITED_R);
  return 1;
}